

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_gc_aggressive_resize_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_gc_aggressive_resize *t)

{
  TD_sylvan_gc_aggressive_resize *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  sylvan_gc_aggressive_resize_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc_aggressive_resize)
{
    size_t nodes_size = llmsset_get_size(nodes);
    size_t nodes_max = llmsset_get_max_size(nodes);
    if (nodes_size < nodes_max) {
        size_t new_size = next_size(nodes_size);
        if (new_size > nodes_max) new_size = nodes_max;
        llmsset_set_size(nodes, new_size);
    }
    size_t cache_size = cache_getsize();
    size_t cache_max = cache_getmaxsize();
    if (cache_size < cache_max) {
        size_t new_size = next_size(cache_size);
        if (new_size > cache_max) new_size = cache_max;
        cache_setsize(new_size);
    }
}